

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HammeringPattern.cpp
# Opt level: O2

PatternAddressMapper * __thiscall
HammeringPattern::get_most_effective_mapping(HammeringPattern *this)

{
  PatternAddressMapper *this_00;
  PatternAddressMapper *pPVar1;
  size_t sVar2;
  size_t sVar3;
  iterator __begin1;
  PatternAddressMapper *this_01;
  string local_50;
  allocator<char> local_29;
  
  this_00 = (this->address_mappings).
            super__Vector_base<PatternAddressMapper,_std::allocator<PatternAddressMapper>_>._M_impl.
            super__Vector_impl_data._M_start;
  pPVar1 = (this->address_mappings).
           super__Vector_base<PatternAddressMapper,_std::allocator<PatternAddressMapper>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this_01 = this_00;
  if (this_00 == pPVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"get_most_effective_mapping() failed: No mappings existing!",
               &local_29);
    Logger::log_error(&local_50,true);
    std::__cxx11::string::~string((string *)&local_50);
    exit(1);
  }
  for (; this_01 != pPVar1; this_01 = this_01 + 1) {
    sVar2 = PatternAddressMapper::count_bitflips(this_01);
    sVar3 = PatternAddressMapper::count_bitflips(this_00);
    if (sVar3 < sVar2) {
      PatternAddressMapper::operator=(this_00,this_01);
    }
  }
  return this_00;
}

Assistant:

PatternAddressMapper &HammeringPattern::get_most_effective_mapping() {
  if (address_mappings.empty()) {
    Logger::log_error("get_most_effective_mapping() failed: No mappings existing!");
    exit(EXIT_FAILURE);
  }
  PatternAddressMapper &best_mapping = address_mappings.front();
  for (const auto& mapping : address_mappings) {
    if (mapping.count_bitflips() > best_mapping.count_bitflips()) {
      best_mapping = mapping;
    }
  }
  return best_mapping;
}